

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yyjson.cpp
# Opt level: O1

bool duckdb_yyjson::skip_spaces_and_comments(u8 **ptr)

{
  byte *pbVar1;
  short sVar2;
  byte *pbVar3;
  byte *pbVar4;
  byte *pbVar5;
  
  pbVar4 = *ptr;
  pbVar5 = *ptr;
  while( true ) {
    while( true ) {
      while (pbVar3 = pbVar4, *(short *)pbVar3 == 0x2f2f) {
        pbVar4 = pbVar3 + 1;
        do {
          pbVar3 = pbVar4 + 1;
          pbVar4 = pbVar4 + 1;
        } while ((char_table[*pbVar3] & 0x40) == 0);
      }
      if (*(short *)pbVar3 != 0x2a2f) break;
      pbVar4 = pbVar3 + 2;
      sVar2 = *(short *)(pbVar3 + 2);
      while (sVar2 != 0x2f2a) {
        if (*pbVar4 == 0) {
          *ptr = pbVar3;
          return false;
        }
        pbVar5 = pbVar4 + 1;
        pbVar4 = pbVar4 + 1;
        sVar2 = *(short *)pbVar5;
      }
      pbVar4 = pbVar4 + 2;
      pbVar5 = pbVar3;
    }
    if ((char_table[*pbVar3] & 1) == 0) break;
    do {
      pbVar1 = pbVar3 + 1;
      pbVar3 = pbVar3 + 1;
      pbVar4 = pbVar3;
    } while ((char_table[*pbVar1] & 1) != 0);
  }
  *ptr = pbVar3;
  return pbVar5 != pbVar3;
}

Assistant:

static_noinline bool skip_spaces_and_comments(u8 **ptr) {
    u8 *hdr = *ptr;
    u8 *cur = *ptr;
    u8 **end = ptr;
    while (true) {
        if (byte_match_2(cur, "/*")) {
            hdr = cur;
            cur += 2;
            while (true) {
                if (byte_match_2(cur, "*/")) {
                    cur += 2;
                    break;
                }
                if (*cur == 0) {
                    *end = hdr;
                    return false;
                }
                cur++;
            }
            continue;
        }
        if (byte_match_2(cur, "//")) {
            cur += 2;
            while (!char_is_line_end(*cur)) cur++;
            continue;
        }
        if (char_is_space(*cur)) {
            cur += 1;
            while (char_is_space(*cur)) cur++;
            continue;
        }
        break;
    }
    *end = cur;
    return hdr != cur;
}